

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

_Bool protect_page(void *p,_Bool rw)

{
  int iVar1;
  
  if (get_page_size_PAGE_SIZE == 0) {
    get_page_size_PAGE_SIZE = sysconf(0x1e);
  }
  iVar1 = mprotect(p,get_page_size_PAGE_SIZE,(uint)rw + (uint)rw * 2);
  return iVar1 == 0;
}

Assistant:

static bool
protect_page(void *p, bool rw)
{
#if HU_OS_POSIX_P
    return mprotect(
             p, get_page_size(), rw ? PROT_READ | PROT_WRITE : PROT_NONE) == 0;
#elif HU_OS_WINDOWS_P
    DWORD old_protect;
    return VirtualProtect(p,
                          get_page_size(),
                          rw ? PAGE_READWRITE : PAGE_NOACCESS,
                          &old_protect) != 0;
#else
#    error "BUG: platform not properly handled"
#endif
}